

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_dirty_update_set_immutable
               (filemgr *file,filemgr_dirty_update_node *prev_node,filemgr_dirty_update_node *node)

{
  int iVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  filemgr_dirty_update_node *pfVar4;
  filemgr *pfVar5;
  pthread_spinlock_t *__lock;
  filemgr *node_00;
  avl_node *node_01;
  filemgr_dirty_update_node *node_02;
  filemgr *file_00;
  bool bVar6;
  void *addr;
  pthread_spinlock_t *local_90;
  avl_tree *local_88;
  filemgr_dirty_update_node *local_80;
  list remove_queue;
  filemgr_dirty_update_block query;
  
  if (node != (filemgr_dirty_update_node *)0x0) {
    remove_queue.head = (list_elem *)0x0;
    remove_queue.tail = (list_elem *)0x0;
    __lock = &file->dirty_update_lock;
    pthread_spin_lock(__lock);
    node->immutable = true;
    if (prev_node != (filemgr_dirty_update_node *)0x0) {
      if (prev_node->immutable == true) {
        bVar6 = (prev_node->ref_count).super___atomic_base<unsigned_int>._M_i == 1;
      }
      else {
        bVar6 = false;
      }
      local_90 = __lock;
      if (prev_node->expired == false) {
        paVar2 = avl_first(&prev_node->dirty_blocks);
      }
      else {
        paVar2 = (avl_node *)0x0;
      }
      local_88 = &prev_node->dirty_blocks;
      local_80 = prev_node;
      while (node_01 = paVar2, node_01 != (avl_node *)0x0) {
        paVar2 = avl_next(node_01);
        if ((*(char *)&node_01[1].right == '\0') &&
           (iVar1 = filemgr_is_writable(file,(bid_t)node_01[1].left), iVar1 != 0)) {
          query.bid = (bid_t)node_01[1].left;
          paVar3 = avl_search(&node->dirty_blocks,&query.avl,_dirty_blocks_cmp);
          if (paVar3 == (avl_node *)0x0) {
            if (bVar6) {
              avl_remove(local_88,node_01);
              paVar3 = node_01;
            }
            else {
              paVar3 = (avl_node *)calloc(1,0x30);
              iVar1 = posix_memalign(&addr,0x200,(ulong)file->blocksize);
              if (iVar1 != 0) {
                addr = (void *)0x0;
              }
              paVar3[1].parent = (avl_node *)addr;
              paVar3[1].left = node_01[1].left;
              *(undefined1 *)&paVar3[1].right = *(undefined1 *)&node_01[1].right;
              memcpy(addr,node_01[1].parent,(ulong)file->blocksize);
              prev_node = local_80;
            }
            avl_insert(&node->dirty_blocks,paVar3,_dirty_blocks_cmp);
          }
        }
        else {
          *(undefined1 *)&node_01[1].right = 1;
        }
      }
      prev_node->expired = true;
      __lock = local_90;
    }
    file->latest_dirty_update = node;
    pfVar4 = (filemgr_dirty_update_node *)avl_first(&file->dirty_update_idx);
    while ((node_02 = pfVar4, node_02 != (filemgr_dirty_update_node *)0x0 && (node_02 != node))) {
      pfVar4 = (filemgr_dirty_update_node *)avl_next((avl_node *)node_02);
      if ((node_02->immutable == true) &&
         ((node_02->ref_count).super___atomic_base<unsigned_int>._M_i == 0)) {
        avl_remove(&file->dirty_update_idx,(avl_node *)node_02);
        list_push_front(&remove_queue,(list_elem *)node_02);
      }
    }
    pthread_spin_unlock(__lock);
    file_00 = (filemgr *)remove_queue.head;
    while (file_00 != (filemgr *)0x0) {
      node_00 = file_00;
      pfVar5 = (filemgr *)list_remove(&remove_queue,(list_elem *)file_00);
      _filemgr_dirty_update_remove_node(file_00,(filemgr_dirty_update_node *)node_00);
      file_00 = pfVar5;
    }
  }
  return;
}

Assistant:

void filemgr_dirty_update_set_immutable(struct filemgr *file,
                                        struct filemgr_dirty_update_node *prev_node,
                                        struct filemgr_dirty_update_node *node)
{
    struct avl_node *a;
    struct filemgr_dirty_update_node *cur_node;
    struct list remove_queue;
    struct list_elem *le;

    if (!node) {
        return;
    }

    list_init(&remove_queue);

    spin_lock(&file->dirty_update_lock);
    node->immutable = true;

    // absorb all blocks that exist in the previous dirty update
    // but not exist in the current dirty update
    if (prev_node) {
        bool migration = false;
        struct avl_node *aa, *bb;
        struct filemgr_dirty_update_block *block, *block_copy, query;

        if (prev_node->immutable && atomic_get_uint32_t(&prev_node->ref_count) == 1) {
            // only the current thread is referring this dirty update entry.
            // we don't need to copy blocks; just migrate them directly.
            migration = true;
        }

        if (prev_node->expired) {
            // skip already copied node as its blocks are already in
            // the new node or DB file
            aa = NULL;
        } else {
            aa = avl_first(&prev_node->dirty_blocks);
        }

        while (aa) {
            block = _get_entry(aa, struct filemgr_dirty_update_block, avl);
            aa = avl_next(aa);

            if (block->immutable || !filemgr_is_writable(file, block->bid)) {
                // this block is already committed.
                // it can happen when previous dirty update was flushed but
                // was not closed as other handle was still referring it.

                // ignore this block and set the flag to avoid future copy
                // (filemgr_is_writable() alone is not enough because a block
                //  can become writable again due to circular block reuse).
                block->immutable = true;
                continue;
            }

            query.bid = block->bid;
            bb = avl_search(&node->dirty_blocks, &query.avl, _dirty_blocks_cmp);
            if (!bb) {
                // not exist in the current dirty update .. copy (or move) it
                if (migration) {
                    // move
                    avl_remove(&prev_node->dirty_blocks, &block->avl);
                    block_copy = block;
                } else {
                    // copy
                    block_copy = (struct filemgr_dirty_update_block *)
                                 calloc(1, sizeof(struct filemgr_dirty_update_block));
                    void *addr;
                    malloc_align(addr, FDB_SECTOR_SIZE, file->blocksize);
                    block_copy->addr = addr;
                    block_copy->bid = block->bid;
                    block_copy->immutable = block->immutable;
                    memcpy(block_copy->addr, block->addr, file->blocksize);
                }
                avl_insert(&node->dirty_blocks, &block_copy->avl, _dirty_blocks_cmp);
            }
        }

        // now we don't need to copy blocks in this node in the future
        prev_node->expired = true;
    }

    // set latest dirty update
    file->latest_dirty_update = node;

    // remove all previous dirty updates whose ref_count == 0
    // (except for 'node')
    a = avl_first(&file->dirty_update_idx);
    while (a) {
        cur_node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        if (cur_node == node) {
            break;
        }
        a = avl_next(a);
        if (cur_node->immutable && atomic_get_uint32_t(&cur_node->ref_count) == 0 &&
            cur_node != node) {
            // detach from tree and insert into remove queue
            avl_remove(&file->dirty_update_idx, &cur_node->avl);
            list_push_front(&remove_queue, &cur_node->le);
        }
    }

    spin_unlock(&file->dirty_update_lock);

    le = list_begin(&remove_queue);
    while (le) {
        cur_node = _get_entry(le, struct filemgr_dirty_update_node, le);
        le = list_remove(&remove_queue, &cur_node->le);
        _filemgr_dirty_update_remove_node(file, cur_node);
    }
}